

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O1

string * gmlc::networking::stripProtocol(string *__return_storage_ptr__,string *networkAddress)

{
  pointer pcVar1;
  size_type sVar2;
  
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (networkAddress,"://",0,3);
  if (sVar2 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (networkAddress->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + networkAddress->_M_string_length);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,networkAddress,sVar2 + 3,0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stripProtocol(const std::string& networkAddress)
{
    auto loc = networkAddress.find("://");
    if (loc != std::string::npos) {
        return networkAddress.substr(loc + 3);
    }
    return networkAddress;
}